

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WatcherInotify.cpp
# Opt level: O0

bool __thiscall efsw::WatcherInotify::inParentTree(WatcherInotify *this,WatcherInotify *parent)

{
  WatcherInotify *local_28;
  WatcherInotify *tNext;
  WatcherInotify *parent_local;
  WatcherInotify *this_local;
  
  local_28 = this->Parent;
  while( true ) {
    if (local_28 == (WatcherInotify *)0x0) {
      return false;
    }
    if (local_28 == parent) break;
    local_28 = local_28->Parent;
  }
  return true;
}

Assistant:

bool WatcherInotify::inParentTree( WatcherInotify* parent ) {
	WatcherInotify* tNext = Parent;

	while ( NULL != tNext ) {
		if ( tNext == parent ) {
			return true;
		}

		tNext = tNext->Parent;
	}

	return false;
}